

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

string * __thiscall
Assimp::FBX::ParseTokenAsString_abi_cxx11_
          (string *__return_storage_ptr__,FBX *this,Token *t,char **err_out)

{
  int iVar1;
  ulong uVar2;
  allocator *paVar3;
  char *pcVar4;
  char *pcVar5;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  t->sbegin = (char *)0x0;
  if (*(int *)(this + 0x10) == 2) {
    if (*(int *)(this + 0x20) == -1) {
      pcVar5 = *(char **)this;
      if (*pcVar5 == 'S') {
        iVar1 = *(int *)(pcVar5 + 1);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = pcVar5 + (long)iVar1 + 5;
        pcVar5 = pcVar5 + 5;
LAB_004eecd8:
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,pcVar5,pcVar4);
        return __return_storage_ptr__;
      }
      t->sbegin = "failed to parse S(tring), unexpected data type (binary)";
      paVar3 = &local_a;
    }
    else {
      pcVar5 = *(char **)this;
      uVar2 = *(long *)(this + 8) - (long)pcVar5;
      if (uVar2 < 2) {
        t->sbegin = "token is too short to hold a string";
        paVar3 = &local_b;
      }
      else {
        if ((*pcVar5 == '\"') && (*(char *)(*(long *)(this + 8) + -1) == '\"')) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar4 = pcVar5 + (uVar2 - 1);
          pcVar5 = pcVar5 + 1;
          goto LAB_004eecd8;
        }
        t->sbegin = "expected double quoted string";
        paVar3 = &local_c;
      }
    }
  }
  else {
    t->sbegin = "expected TOK_DATA token";
    paVar3 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",paVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string ParseTokenAsString(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return "";
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'S') {
            err_out = "failed to parse S(tring), unexpected data type (binary)";
            return "";
        }

        // read string length
        BE_NCONST int32_t len = SafeParse<int32_t>(data+1, t.end());
        AI_SWAP4(len);

        ai_assert(t.end() - data == 5 + len);
        return std::string(data + 5, len);
    }

    const size_t length = static_cast<size_t>(t.end() - t.begin());
    if(length < 2) {
        err_out = "token is too short to hold a string";
        return "";
    }

    const char* s = t.begin(), *e = t.end() - 1;
    if (*s != '\"' || *e != '\"') {
        err_out = "expected double quoted string";
        return "";
    }

    return std::string(s+1,length-2);
}